

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PClass::InitializeSpecials(PClass *this,void *addr)

{
  BYTE *pBVar1;
  pair<const_PType_*,_unsigned_int> *ppVar2;
  ulong uVar3;
  pair<const_PType_*,_unsigned_int> *ppVar4;
  
  if (this->bRuntimeClass == true) {
    if (this->ParentClass == (PClass *)0x0) {
      __assert_fail("ParentClass != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0xc5f,"void PClass::InitializeSpecials(void *) const");
    }
    InitializeSpecials(this->ParentClass,addr);
    uVar3 = (ulong)(this->SpecialInits).Count;
    if (uVar3 != 0) {
      ppVar2 = (this->SpecialInits).Array;
      ppVar4 = ppVar2 + uVar3;
      do {
        pBVar1 = this->Defaults + ppVar2->second;
        if (this->Defaults == (BYTE *)0x0) {
          pBVar1 = (BYTE *)0x0;
        }
        (*(ppVar2->first->super_PTypeBase).super_DObject._vptr_DObject[0xd])
                  (ppVar2->first,(long)addr + (ulong)ppVar2->second,pBVar1);
        ppVar2 = ppVar2 + 1;
      } while (ppVar2 != ppVar4);
    }
  }
  return;
}

Assistant:

void PClass::InitializeSpecials(void *addr) const
{
	// Once we reach a native class, we can stop going up the family tree,
	// since native classes handle initialization natively.
	if (!bRuntimeClass)
	{
		return;
	}
	assert(ParentClass != NULL);
	ParentClass->InitializeSpecials(addr);
	for (auto tao : SpecialInits)
	{
		tao.first->InitializeValue((BYTE*)addr + tao.second, Defaults == nullptr? nullptr : Defaults + tao.second);
	}
}